

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

stb_vorbis * stb_vorbis_open_memory(uchar *data,int len,int *error,stb_vorbis_alloc *alloc)

{
  int iVar1;
  undefined1 local_7a8 [8];
  stb_vorbis p;
  stb_vorbis *f;
  stb_vorbis_alloc *alloc_local;
  int *error_local;
  int len_local;
  uchar *data_local;
  
  if (data != (uchar *)0x0) {
    vorbis_init((stb_vorbis *)local_7a8,alloc);
    p.stream_start = data + len;
    p.stream_end._4_1_ = 0;
    p._56_8_ = data;
    p.stream = data;
    p.stream_end._0_4_ = len;
    iVar1 = start_decoder((vorb *)local_7a8);
    if (iVar1 != 0) {
      p._1896_8_ = vorbis_alloc((stb_vorbis *)local_7a8);
      if ((stb_vorbis *)p._1896_8_ != (stb_vorbis *)0x0) {
        memcpy((void *)p._1896_8_,local_7a8,0x770);
        vorbis_pump_first_frame((stb_vorbis *)p._1896_8_);
        if (error != (int *)0x0) {
          *error = 0;
        }
        return (stb_vorbis *)p._1896_8_;
      }
      p.channel_buffer_end = 0;
      p._1900_4_ = 0;
    }
    if (error != (int *)0x0) {
      *error = p.temp_offset;
    }
    vorbis_deinit((stb_vorbis *)local_7a8);
  }
  return (stb_vorbis *)0x0;
}

Assistant:

stb_vorbis * stb_vorbis_open_memory(const unsigned char *data, int len, int *error, const stb_vorbis_alloc *alloc)
{
   stb_vorbis *f, p;
   if (data == NULL) return NULL;
   vorbis_init(&p, alloc);
   p.stream = (uint8 *) data;
   p.stream_end = (uint8 *) data + len;
   p.stream_start = (uint8 *) p.stream;
   p.stream_len = len;
   p.push_mode = FALSE;
   if (start_decoder(&p)) {
      f = vorbis_alloc(&p);
      if (f) {
         *f = p;
         vorbis_pump_first_frame(f);
         if (error) *error = VORBIS__no_error;
         return f;
      }
   }
   if (error) *error = p.error;
   vorbis_deinit(&p);
   return NULL;
}